

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cgi::connection::async_write_handler::async_write_handler
          (async_write_handler *this,conn_type *c,vector<char,_std::allocator<char>_> *d,
          handler *hin)

{
  mutable_buffer local_90;
  buffer_impl<const_char_*> local_60;
  
  booster::callable<void_(const_std::error_code_&)>::callable
            (&this->super_callable<void_(const_std::error_code_&)>);
  (this->super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__async_write_handler_002b2ef8;
  (this->output).super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->output).super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            (&(this->h).call_ptr,&hin->call_ptr);
  std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->conn).
              super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>,
             &c->super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
  std::_Vector_base<char,_std::allocator<char>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->data,(_Vector_impl_data *)d);
  booster::aio::buffer(&local_90,&this->data);
  booster::aio::const_buffer::const_buffer((const_buffer *)&local_60,&local_90);
  booster::aio::buffer_impl<const_char_*>::operator=
            (&(this->output).super_buffer_impl<const_char_*>,&local_60);
  std::
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::~_Vector_base(&local_60.vec_.
                   super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 );
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base(&local_90.super_buffer_impl<char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                 );
  return;
}

Assistant:

async_write_handler(conn_type const &c,std::vector<char> &d,handler const &hin) :
		h(hin),
		conn(c)
	{
		data.swap(d);
		output = booster::aio::buffer(data);
	}